

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c_portable.cc
# Opt level: O3

uint32_t crc32c::ExtendPortable(uint32_t crc,uint8_t *data,size_t size)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  long lVar4;
  uint *puVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint *puVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long in_FS_OFFSET;
  
  puVar5 = (uint *)(data + size);
  uVar9 = (ulong)~crc;
  puVar3 = (uint *)((ulong)(data + 3) & 0xfffffffffffffffc);
  puVar6 = (uint *)data;
  if ((long)puVar3 - (long)data != 0 && puVar3 <= puVar5) {
    do {
      puVar10 = (uint *)((long)puVar6 + 1);
      uVar9 = (ulong)((uint)(uVar9 >> 8) ^
                     *(uint *)(::(anonymous_namespace)::kByteExtensionTable +
                              (ulong)((uint)(byte)*puVar6 ^ (uint)uVar9 & 0xff) * 4));
      puVar6 = puVar10;
    } while (puVar10 != puVar3);
    puVar6 = (uint *)(data + ((long)puVar3 - (long)data));
    data = (uint8_t *)puVar3;
  }
  if (0xf < (long)puVar5 - (long)data) {
    uVar7 = (uint)uVar9 ^ *puVar6;
    uVar8 = puVar6[1];
    uVar13 = puVar6[2];
    uVar12 = puVar6[3];
    puVar6 = puVar6 + 4;
    for (lVar4 = (long)puVar5 - (long)puVar6; 0x100 < lVar4; lVar4 = lVar4 + -0x40) {
      uVar7 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar7 & 0xff) * 4)
              ^ *puVar6 ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar7 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar7 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar7 >> 0x18) * 4
                       );
      uVar8 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar8 & 0xff) * 4)
              ^ puVar6[1] ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar8 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar8 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar8 >> 0x18) * 4
                       );
      uVar13 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar13 & 0xff) * 4) ^ puVar6[2] ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar13 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar13 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar13 >> 0x18) * 4);
      uVar12 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar12 & 0xff) * 4) ^ puVar6[3] ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar12 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar12 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar12 >> 0x18) * 4);
      uVar7 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar7 & 0xff) * 4)
              ^ puVar6[4] ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar7 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar7 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar7 >> 0x18) * 4
                       );
      uVar8 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar8 & 0xff) * 4)
              ^ puVar6[5] ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar8 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar8 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar8 >> 0x18) * 4
                       );
      uVar13 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar13 & 0xff) * 4) ^ puVar6[6] ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar13 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar13 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar13 >> 0x18) * 4);
      uVar12 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar12 & 0xff) * 4) ^ puVar6[7] ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar12 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar12 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar12 >> 0x18) * 4);
      uVar7 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar7 & 0xff) * 4)
              ^ puVar6[8] ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar7 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar7 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar7 >> 0x18) * 4
                       );
      uVar8 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar8 & 0xff) * 4)
              ^ puVar6[9] ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar8 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar8 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar8 >> 0x18) * 4
                       );
      uVar13 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar13 & 0xff) * 4) ^ puVar6[10] ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar13 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar13 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar13 >> 0x18) * 4);
      uVar12 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar12 & 0xff) * 4) ^ puVar6[0xb] ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar12 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar12 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar12 >> 0x18) * 4);
      uVar7 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar7 & 0xff) * 4)
              ^ puVar6[0xc] ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar7 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar7 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar7 >> 0x18) * 4
                       );
      uVar8 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar8 & 0xff) * 4)
              ^ puVar6[0xd] ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar8 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar8 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar8 >> 0x18) * 4
                       );
      uVar13 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar13 & 0xff) * 4) ^ puVar6[0xe] ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar13 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar13 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar13 >> 0x18) * 4);
      uVar12 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar12 & 0xff) * 4) ^ puVar6[0xf] ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar12 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar12 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar12 >> 0x18) * 4);
      puVar6 = puVar6 + 0x10;
    }
    if (0xf < lVar4) {
      lVar4 = (long)puVar5 - (long)puVar6;
      do {
        uVar7 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                         (ulong)(uVar7 & 0xff) * 4) ^ *puVar6 ^
                *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                         (ulong)(uVar7 >> 8 & 0xff) * 4) ^
                *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar7 >> 0xe & 0x3fc))
                ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                           (ulong)(uVar7 >> 0x18) * 4);
        uVar8 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                         (ulong)(uVar8 & 0xff) * 4) ^ puVar6[1] ^
                *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                         (ulong)(uVar8 >> 8 & 0xff) * 4) ^
                *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar8 >> 0xe & 0x3fc))
                ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                           (ulong)(uVar8 >> 0x18) * 4);
        uVar13 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                          (ulong)(uVar13 & 0xff) * 4) ^ puVar6[2] ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(uVar13 >> 8 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar13 >> 0xe & 0x3fc)
                          ) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar13 >> 0x18) * 4);
        uVar12 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                          (ulong)(uVar12 & 0xff) * 4) ^ puVar6[3] ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(uVar12 >> 8 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar12 >> 0xe & 0x3fc)
                          ) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar12 >> 0x18) * 4);
        puVar6 = puVar6 + 4;
        lVar4 = lVar4 + -0x10;
      } while (0xf < lVar4);
    }
    if (3 < lVar4) {
      lVar4 = (long)puVar5 - (long)puVar6;
      uVar11 = uVar7;
      uVar1 = uVar8;
      uVar2 = uVar13;
      do {
        uVar13 = uVar12;
        uVar8 = uVar2;
        uVar7 = uVar1;
        uVar12 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                          (ulong)(uVar11 & 0xff) * 4) ^ *puVar6 ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(uVar11 >> 8 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar11 >> 0xe & 0x3fc)
                          ) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar11 >> 0x18) * 4);
        puVar6 = puVar6 + 1;
        lVar4 = lVar4 + -4;
        uVar11 = uVar7;
        uVar1 = uVar8;
        uVar2 = uVar13;
      } while (3 < lVar4);
    }
    lVar4 = 4;
    do {
      uVar7 = uVar7 >> 8 ^
              *(uint *)(::(anonymous_namespace)::kByteExtensionTable + ((ulong)uVar7 & 0xff) * 4);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    uVar7 = uVar7 ^ uVar8;
    lVar4 = 4;
    do {
      uVar7 = uVar7 >> 8 ^
              *(uint *)(::(anonymous_namespace)::kByteExtensionTable + (ulong)(uVar7 & 0xff) * 4);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    uVar7 = uVar7 ^ uVar13;
    lVar4 = 4;
    do {
      uVar7 = uVar7 >> 8 ^
              *(uint *)(::(anonymous_namespace)::kByteExtensionTable + (ulong)(uVar7 & 0xff) * 4);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    uVar9 = (ulong)(uVar7 ^ uVar12);
    lVar4 = 4;
    do {
      uVar9 = (ulong)((uint)(uVar9 >> 8) ^
                     *(uint *)(::(anonymous_namespace)::kByteExtensionTable + (uVar9 & 0xff) * 4));
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  uVar8 = (uint)uVar9;
  for (; puVar6 != puVar5; puVar6 = (uint *)((long)puVar6 + 1)) {
    uVar8 = (uint)(uVar9 >> 8) ^
            *(uint *)(::(anonymous_namespace)::kByteExtensionTable +
                     (ulong)((uint)(byte)*puVar6 ^ (uint)uVar9 & 0xff) * 4);
    uVar9 = (ulong)uVar8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return ~uVar8;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t ExtendPortable(uint32_t crc, const uint8_t* data, size_t size) {
  const uint8_t* p = data;
  const uint8_t* e = p + size;
  uint32_t l = crc ^ kCRC32Xor;

// Process one byte at a time.
#define STEP1                              \
  do {                                     \
    int c = (l & 0xff) ^ *p++;             \
    l = kByteExtensionTable[c] ^ (l >> 8); \
  } while (0)

// Process one of the 4 strides of 4-byte data.
#define STEP4(s)                                                               \
  do {                                                                         \
    crc##s = ReadUint32LE(p + s * 4) ^ kStrideExtensionTable3[crc##s & 0xff] ^ \
             kStrideExtensionTable2[(crc##s >> 8) & 0xff] ^                    \
             kStrideExtensionTable1[(crc##s >> 16) & 0xff] ^                   \
             kStrideExtensionTable0[crc##s >> 24];                             \
  } while (0)

// Process a 16-byte swath of 4 strides, each of which has 4 bytes of data.
#define STEP16 \
  do {         \
    STEP4(0);  \
    STEP4(1);  \
    STEP4(2);  \
    STEP4(3);  \
    p += 16;   \
  } while (0)

// Process 4 bytes that were already loaded into a word.
#define STEP4W(w)                                   \
  do {                                              \
    w ^= l;                                         \
    for (size_t i = 0; i < 4; ++i) {                \
      w = (w >> 8) ^ kByteExtensionTable[w & 0xff]; \
    }                                               \
    l = w;                                          \
  } while (0)

  // Point x at first 4-byte aligned byte in the buffer. This might be past the
  // end of the buffer.
  const uint8_t* x = RoundUp<4>(p);
  if (x <= e) {
    // Process bytes p is 4-byte aligned.
    while (p != x) {
      STEP1;
    }
  }

  if ((e - p) >= 16) {
    // Load a 16-byte swath into the stride partial results.
    uint32_t crc0 = ReadUint32LE(p + 0 * 4) ^ l;
    uint32_t crc1 = ReadUint32LE(p + 1 * 4);
    uint32_t crc2 = ReadUint32LE(p + 2 * 4);
    uint32_t crc3 = ReadUint32LE(p + 3 * 4);
    p += 16;

    while ((e - p) > kPrefetchHorizon) {
      RequestPrefetch(p + kPrefetchHorizon);

      // Process 64 bytes at a time.
      STEP16;
      STEP16;
      STEP16;
      STEP16;
    }

    // Process one 16-byte swath at a time.
    while ((e - p) >= 16) {
      STEP16;
    }

    // Advance one word at a time as far as possible.
    while ((e - p) >= 4) {
      STEP4(0);
      uint32_t tmp = crc0;
      crc0 = crc1;
      crc1 = crc2;
      crc2 = crc3;
      crc3 = tmp;
      p += 4;
    }

    // Combine the 4 partial stride results.
    l = 0;
    STEP4W(crc0);
    STEP4W(crc1);
    STEP4W(crc2);
    STEP4W(crc3);
  }

  // Process the last few bytes.
  while (p != e) {
    STEP1;
  }
#undef STEP4W
#undef STEP16
#undef STEP4
#undef STEP1
  return l ^ kCRC32Xor;
}